

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void attachBackupObject(sqlite3_backup *p)

{
  Pager *pPager;
  sqlite3_backup **ppsVar1;
  sqlite3_backup *in_RDI;
  sqlite3_backup **pp;
  
  pPager = sqlite3BtreePager(in_RDI->pSrc);
  ppsVar1 = sqlite3PagerBackupPtr(pPager);
  in_RDI->pNext = *ppsVar1;
  *ppsVar1 = in_RDI;
  in_RDI->isAttached = 1;
  return;
}

Assistant:

static void attachBackupObject(sqlite3_backup *p){
  sqlite3_backup **pp;
  assert( sqlite3BtreeHoldsMutex(p->pSrc) );
  pp = sqlite3PagerBackupPtr(sqlite3BtreePager(p->pSrc));
  p->pNext = *pp;
  *pp = p;
  p->isAttached = 1;
}